

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O2

void __thiscall vigra::BmpDecoderImpl::read_8bit_data(BmpDecoderImpl *this)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint i;
  _Ios_Seekdir _Var4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int x;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  uVar1 = (this->grayscale ^ 1) * 2 + 1;
  uVar8 = (this->info_header).width * uVar1;
  uVar5 = (ulong)((this->info_header).height * uVar8);
  std::istream::seekg((long)this,(this->file_header).offset);
  void_vector_base::resize(&(this->pixels).super_void_vector_base,uVar5);
  iVar7 = (this->info_header).height;
  iVar6 = (this->info_header).width % 4;
  _Var4 = 4 - iVar6;
  if (iVar6 == 0) {
    _Var4 = _S_beg;
  }
  lVar10 = uVar5 + (long)(this->pixels).super_void_vector_base.m_data;
  while (0 < iVar7) {
    iVar7 = iVar7 + -1;
    lVar10 = lVar10 - (ulong)uVar8;
    lVar9 = lVar10;
    for (iVar6 = 0; iVar6 < (this->info_header).width; iVar6 = iVar6 + 1) {
      iVar3 = std::istream::get();
      pvVar2 = (this->map).super_void_vector_base.m_data;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined1 *)(lVar9 + uVar5) = *(undefined1 *)((long)pvVar2 + uVar5 + (long)(iVar3 * 3));
      }
      lVar9 = lVar9 + (ulong)uVar1;
    }
    std::istream::seekg((long)this,_Var4);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_8bit_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each line (must end on a 32-bit boundary)
    unsigned int pad_size = info_header.width % 4;
    if ( pad_size > 0 )
        pad_size = 4 - pad_size;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover = base;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {

            // get the color byte
            const int index = stream.get();

            // map and assign the pixel
            const UInt8 * map_base = map.data() + 3 * index;
            for ( unsigned int i = 0; i < ncomp; ++i )
                mover[i] = map_base[i];
            mover += ncomp;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}